

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void assembler::anon_unknown_0::execute_operation<assembler::(anonymous_namespace)::ShlOper>
               (operand operand1,operand operand2,uint64_t operand1_mem,uint64_t operand2_mem,
               registers *regs)

{
  uint64_t *left;
  uint64_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *oprnd2_8_1;
  uint8_t *oprnd1_8;
  uint8_t *oprnd2_8;
  uint64_t *oprnd2;
  uint64_t *oprnd1;
  registers *regs_local;
  uint64_t operand2_mem_local;
  uint64_t operand1_mem_local;
  operand operand2_local;
  operand operand1_local;
  
  left = get_address_64bit(operand1,operand1_mem,regs);
  if (left == (uint64_t *)0x0) {
    puVar2 = get_address_8bit(operand1,operand1_mem,regs);
    if (puVar2 != (uint8_t *)0x0) {
      puVar3 = get_address_8bit(operand2,operand2_mem,regs);
      if (puVar3 == (uint8_t *)0x0) {
        if (operand2 == NUMBER) {
          ShlOper::apply(puVar2,operand2_mem);
        }
      }
      else {
        ShlOper::apply(puVar2,*puVar3);
      }
    }
  }
  else {
    puVar1 = get_address_64bit(operand2,operand2_mem,regs);
    if (puVar1 == (uint64_t *)0x0) {
      if ((operand2 == NUMBER) || (operand2 == LABELADDRESS)) {
        ShlOper::apply(left,operand2_mem);
      }
      else {
        puVar2 = get_address_8bit(operand2,operand2_mem,regs);
        if (puVar2 != (uint8_t *)0x0) {
          ShlOper::apply(left,*puVar2);
        }
      }
    }
    else {
      ShlOper::apply(left,*puVar1);
    }
  }
  return;
}

Assistant:

inline void execute_operation(asmcode::operand operand1,
    asmcode::operand operand2,
    uint64_t operand1_mem,
    uint64_t operand2_mem,
    registers& regs)
    {
    uint64_t* oprnd1 = get_address_64bit(operand1, operand1_mem, regs);
    if (oprnd1)
      {
      uint64_t* oprnd2 = get_address_64bit(operand2, operand2_mem, regs);
      if (oprnd2)
        TOper::apply(*oprnd1, *oprnd2);
      else if (operand2 == asmcode::NUMBER || operand2 == asmcode::LABELADDRESS)
        TOper::apply(*oprnd1, operand2_mem);
      else
        {
        uint8_t* oprnd2_8 = get_address_8bit(operand2, operand2_mem, regs);
        if (oprnd2_8)
          TOper::apply(*oprnd1, *oprnd2_8);
        }
      }
    else
      {
      uint8_t* oprnd1_8 = get_address_8bit(operand1, operand1_mem, regs);
      if (oprnd1_8)
        {
        uint8_t* oprnd2_8 = get_address_8bit(operand2, operand2_mem, regs);
        if (oprnd2_8)
          TOper::apply(*oprnd1_8, *oprnd2_8);
        else if (operand2 == asmcode::NUMBER)
          TOper::apply(*oprnd1_8, operand2_mem);
        }
      }
    }